

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O3

void single_transfer_cleanup(OperationConfig *config)

{
  URLGlob *pUVar1;
  
  if (config != (OperationConfig *)0x0) {
    pUVar1 = (config->state).urls;
    if (pUVar1 != (URLGlob *)0x0) {
      glob_cleanup(pUVar1);
      (config->state).urls = (URLGlob *)0x0;
    }
    free((config->state).outfiles);
    (config->state).outfiles = (char *)0x0;
    free((config->state).uploadfile);
    (config->state).uploadfile = (char *)0x0;
    pUVar1 = (config->state).inglob;
    if (pUVar1 != (URLGlob *)0x0) {
      glob_cleanup(pUVar1);
      (config->state).inglob = (URLGlob *)0x0;
    }
  }
  return;
}

Assistant:

void single_transfer_cleanup(struct OperationConfig *config)
{
  if(config) {
    struct State *state = &config->state;
    if(state->urls) {
      /* Free list of remaining URLs */
      glob_cleanup(state->urls);
      state->urls = NULL;
    }
    Curl_safefree(state->outfiles);
    Curl_safefree(state->uploadfile);
    if(state->inglob) {
      /* Free list of globbed upload files */
      glob_cleanup(state->inglob);
      state->inglob = NULL;
    }
  }
}